

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_pmaps.cc
# Opt level: O2

void * v2i_POLICY_MAPPINGS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  int line;
  OPENSSL_STACK *sk;
  size_t sVar1;
  undefined8 *puVar2;
  POLICY_MAPPING *a;
  ASN1_OBJECT *pAVar3;
  ulong i;
  
  sk = OPENSSL_sk_new_null();
  if (sk != (OPENSSL_STACK *)0x0) {
    i = 0;
    do {
      sVar1 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      if (sVar1 <= i) {
        return sk;
      }
      puVar2 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)nval,i);
      if ((puVar2[2] == 0) || (puVar2[1] == 0)) {
        line = 0x55;
        goto LAB_00203c4f;
      }
      a = POLICY_MAPPING_new();
      if ((a == (POLICY_MAPPING *)0x0) || (sVar1 = OPENSSL_sk_push(sk,a), sVar1 == 0)) {
        POLICY_MAPPING_free(a);
        goto LAB_00203c95;
      }
      pAVar3 = OBJ_txt2obj((char *)puVar2[1],0);
      a->issuerDomainPolicy = pAVar3;
      pAVar3 = OBJ_txt2obj((char *)puVar2[2],0);
      a->subjectDomainPolicy = pAVar3;
    } while ((a->issuerDomainPolicy != (ASN1_OBJECT *)0x0) &&
            (i = i + 1, pAVar3 != (ASN1_OBJECT *)0x0));
    line = 99;
LAB_00203c4f:
    ERR_put_error(0x14,0,0x81,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_pmaps.cc"
                  ,line);
    ERR_add_error_data(6,"section:",*puVar2,",name:",puVar2[1],",value:",puVar2[2]);
LAB_00203c95:
    sk_POLICY_MAPPING_pop_free((stack_st_POLICY_MAPPING *)sk,POLICY_MAPPING_free);
  }
  return (void *)0x0;
}

Assistant:

static void *v2i_POLICY_MAPPINGS(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  POLICY_MAPPINGS *pmaps = sk_POLICY_MAPPING_new_null();
  if (pmaps == NULL) {
    return NULL;
  }

  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    if (!val->value || !val->name) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
      X509V3_conf_err(val);
      goto err;
    }

    POLICY_MAPPING *pmap = POLICY_MAPPING_new();
    if (pmap == NULL || !sk_POLICY_MAPPING_push(pmaps, pmap)) {
      POLICY_MAPPING_free(pmap);
      goto err;
    }

    pmap->issuerDomainPolicy = OBJ_txt2obj(val->name, 0);
    pmap->subjectDomainPolicy = OBJ_txt2obj(val->value, 0);
    if (!pmap->issuerDomainPolicy || !pmap->subjectDomainPolicy) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
      X509V3_conf_err(val);
      goto err;
    }
  }
  return pmaps;

err:
  sk_POLICY_MAPPING_pop_free(pmaps, POLICY_MAPPING_free);
  return NULL;
}